

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

size_t mpeg_bitstream_parse
                 (mpeg_bitstream_t *packet,caption_frame_t *frame,uint8_t *data,size_t size,
                 uint stream_type,double dts,double cts)

{
  sei_message_t *psVar1;
  uint8_t uVar2;
  uint uVar3;
  libcaption_stauts_t lVar4;
  libcaption_stauts_t lVar5;
  cea708_t *pcVar6;
  libcaption_stauts_t lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __n;
  ulong __n_00;
  sei_message_t **ppsVar10;
  double timestamp;
  sei_t sei;
  
  uVar8 = packet->size;
  if (uVar8 < 0x600000) {
    __n = 0x600000 - uVar8;
    if (uVar8 + size < 0x600000) {
      __n = size;
    }
    packet->status = LIBCAPTION_OK;
    memcpy(packet->data + uVar8,data,__n);
    __n_00 = packet->size + __n;
    packet->size = __n_00;
    uVar8 = 4;
    if (stream_type != 0x1b) {
      uVar8 = (ulong)(stream_type == 0x24) * 5;
    }
    timestamp = cts + dts;
    while (uVar3 = 0xffffffff, packet->status == LIBCAPTION_OK) {
      uVar9 = 0;
      while( true ) {
        if (__n_00 <= uVar9 + 1) {
          return __n;
        }
        if (uVar3 << 8 == 0x100) break;
        uVar3 = uVar3 << 8 | (uint)packet->data[uVar9 + 1];
        uVar9 = uVar9 + 1;
      }
      if (uVar9 == 2) {
        return __n;
      }
      uVar2 = mpeg_bitstream_packet_type(packet,stream_type);
      if ((uVar2 == '\x06') || (uVar2 == '\'')) {
        if (uVar8 < uVar9 - 2 && (stream_type == 0x24 || stream_type == 0x1b)) {
          lVar5 = sei_parse(&sei,packet->data + uVar8,(-2 - uVar8) + uVar9,timestamp);
          packet->status = lVar5;
          ppsVar10 = &sei.head;
          while (psVar1 = *ppsVar10, psVar1 != (sei_message_t *)0x0) {
            if (psVar1->type == sei_type_user_data_registered_itu_t_t35) {
              pcVar6 = _mpeg_bitstream_cea708_emplace_back(packet,timestamp);
              lVar5 = packet->status;
              lVar4 = cea708_parse_h264((uint8_t *)(psVar1 + 1),psVar1->size,pcVar6);
              lVar7 = lVar4;
              if (lVar5 == LIBCAPTION_READY) {
                lVar7 = lVar5;
              }
              if (lVar4 == LIBCAPTION_ERROR) {
                lVar7 = lVar4;
              }
              if (lVar5 == LIBCAPTION_ERROR) {
                lVar7 = lVar5;
              }
              packet->status = lVar7;
              _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
            }
            ppsVar10 = &psVar1->next;
          }
          sei_free(&sei);
        }
      }
      else if ((uVar2 == 0xb2) && (4 < uVar9 - 2 && stream_type == 2)) {
        pcVar6 = _mpeg_bitstream_cea708_emplace_back(packet,timestamp);
        lVar5 = packet->status;
        lVar4 = cea708_parse_h262(packet->data + 4,uVar9 - 6,pcVar6);
        lVar7 = lVar4;
        if (lVar5 == LIBCAPTION_READY) {
          lVar7 = lVar5;
        }
        if (lVar4 == LIBCAPTION_ERROR) {
          lVar7 = lVar4;
        }
        if (lVar5 == LIBCAPTION_ERROR) {
          lVar7 = lVar5;
        }
        packet->status = lVar7;
        _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
      }
      __n_00 = (packet->size - uVar9) + 2;
      packet->size = __n_00;
      memmove(packet->data,packet->data + (uVar9 - 2),__n_00);
    }
  }
  else {
    packet->status = LIBCAPTION_ERROR;
    __n = 0;
  }
  return __n;
}

Assistant:

size_t mpeg_bitstream_parse(mpeg_bitstream_t* packet, caption_frame_t* frame, const uint8_t* data, size_t size, unsigned stream_type, double dts, double cts)
{
    if (MAX_NALU_SIZE <= packet->size) {
        packet->status = LIBCAPTION_ERROR;
        // fprintf(stderr, "LIBCAPTION_ERROR\n");
        return 0;
    }

    // consume upto MAX_NALU_SIZE bytes
    if (MAX_NALU_SIZE <= packet->size + size) {
        size = MAX_NALU_SIZE - packet->size;
    }

    sei_t sei;
    size_t header_size, scpos;
    packet->status = LIBCAPTION_OK;
    memcpy(&packet->data[packet->size], data, size);
    packet->size += size;

    while (packet->status == LIBCAPTION_OK && 0 < (scpos = find_start_code(&packet->data[0], packet->size))) {
        switch (mpeg_bitstream_packet_type(packet, stream_type)) {
        default:
            break;
        case H262_SEI_PACKET:
            header_size = 4;
            if (STREAM_TYPE_H262 == stream_type && scpos > header_size) {
                cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                packet->status = libcaption_status_update(packet->status, cea708_parse_h262(&packet->data[header_size], scpos - header_size, cea708));
                _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
            }
            break;
        case H264_SEI_PACKET:
        case H265_SEI_PACKET:
            header_size = STREAM_TYPE_H264 == stream_type ? 4 : STREAM_TYPE_H265 == stream_type ? 5 : 0;
            if (header_size && scpos > header_size) {
                packet->status = libcaption_status_update(packet->status, sei_parse(&sei, &packet->data[header_size], scpos - header_size, dts + cts));
                for (sei_message_t* msg = sei_message_head(&sei); msg; msg = sei_message_next(msg)) {
                    if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
                        cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                        packet->status = libcaption_status_update(packet->status, cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), cea708));
                        _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
                    }
                }
                sei_free(&sei);
            }
            break;
        }

        packet->size -= scpos;
        memmove(&packet->data[0], &packet->data[scpos], packet->size);
    }

    return size;
}